

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAi_kry.c
# Opt level: O1

void GSIter(sunrealtype gamma,N_Vector z,N_Vector x,WebData wdata)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  char cVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  char cVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  double dVar20;
  double dVar21;
  sunrealtype gam2 [6];
  sunrealtype gam [6];
  sunrealtype beta2 [6];
  sunrealtype beta [6];
  sunrealtype cof1 [6];
  ulong local_1b8;
  double adStack_128 [6];
  double adStack_f8 [6];
  double adStack_c8 [6];
  double adStack_98 [6];
  double adStack_68 [7];
  
  lVar4 = N_VGetArrayPointer(x);
  lVar5 = N_VGetArrayPointer(z);
  uVar14 = wdata->ns;
  uVar10 = (ulong)uVar14;
  uVar2 = wdata->mx;
  uVar3 = wdata->my;
  uVar9 = (ulong)uVar3;
  if (0 < (long)(int)uVar14) {
    lVar8 = 0;
    do {
      dVar20 = *(double *)((long)wdata->cox + lVar8);
      dVar1 = *(double *)((long)wdata->coy + lVar8);
      dVar21 = 1.0 / ((dVar20 + dVar1) * (gamma + gamma) + 1.0);
      dVar20 = dVar20 * gamma * dVar21;
      *(double *)((long)adStack_98 + lVar8) = dVar20;
      *(double *)((long)adStack_c8 + lVar8) = dVar20 + dVar20;
      dVar20 = dVar1 * gamma * dVar21;
      *(double *)((long)adStack_f8 + lVar8) = dVar20;
      *(double *)((long)adStack_128 + lVar8) = dVar20 + dVar20;
      *(double *)((long)adStack_68 + lVar8) = dVar21;
      lVar8 = lVar8 + 8;
    } while (uVar10 * 8 - lVar8 != 0);
  }
  lVar8 = (long)wdata->mxns;
  if (0 < (int)uVar3) {
    lVar19 = (long)(int)uVar14 * 8;
    uVar11 = 0;
    lVar12 = lVar4;
    do {
      if (0 < (int)uVar2) {
        uVar17 = 0;
        lVar15 = lVar5;
        lVar16 = lVar12;
        do {
          if (0 < (int)uVar14) {
            uVar18 = 0;
            do {
              *(double *)(lVar16 + uVar18 * 8) =
                   adStack_68[uVar18] * *(double *)(lVar15 + uVar18 * 8);
              uVar18 = uVar18 + 1;
            } while (uVar10 != uVar18);
          }
          uVar17 = uVar17 + 1;
          lVar16 = lVar16 + lVar19;
          lVar15 = lVar15 + lVar19;
        } while (uVar17 != uVar2);
      }
      uVar11 = uVar11 + 1;
      lVar12 = lVar12 + lVar8 * 8;
      lVar5 = lVar5 + lVar8 * 8;
    } while (uVar11 != uVar9);
  }
  N_VConst(0,z);
  lVar19 = (long)(int)uVar14 * -8;
  lVar5 = lVar8 * -8;
  uVar6 = 1;
  do {
    if (1 < uVar6 && 0 < (int)uVar3) {
      local_1b8 = 0;
      do {
        if (0 < (int)uVar2) {
          uVar14 = (uint)(local_1b8 == uVar3 - 1) * 3 + 3;
          if (local_1b8 == 0) {
            uVar14 = 0;
          }
          (*(code *)((long)&DAT_00105108 + (long)(int)(&DAT_00105108)[uVar14]))();
          return;
        }
        local_1b8 = local_1b8 + 1;
      } while (local_1b8 != uVar9);
    }
    if (0 < (int)uVar3) {
      uVar11 = 0;
      lVar12 = lVar4;
      do {
        if (0 < (int)uVar2) {
          cVar7 = (uVar11 == uVar3 - 1) * '\x03' + '\x03';
          if (uVar11 == 0) {
            cVar7 = '\0';
          }
          uVar17 = 0;
          lVar15 = lVar12;
          do {
            cVar13 = (uVar17 == uVar2 - 1) + '\x01';
            if (uVar17 == 0) {
              cVar13 = '\0';
            }
            switch(cVar13 + cVar7) {
            case '\x01':
              if (0 < (int)uVar14) {
                uVar18 = 0;
                do {
                  *(double *)(lVar15 + uVar18 * 8) =
                       adStack_98[uVar18] * *(double *)(lVar15 + lVar19 + uVar18 * 8) +
                       *(double *)(lVar15 + uVar18 * 8);
                  uVar18 = uVar18 + 1;
                } while (uVar10 != uVar18);
              }
              break;
            case '\x02':
              if (0 < (int)uVar14) {
                uVar18 = 0;
                do {
                  *(double *)(lVar15 + uVar18 * 8) =
                       adStack_c8[uVar18] * *(double *)(lVar15 + lVar19 + uVar18 * 8) +
                       *(double *)(lVar15 + uVar18 * 8);
                  uVar18 = uVar18 + 1;
                } while (uVar10 != uVar18);
              }
              break;
            case '\x03':
              if (0 < (int)uVar14) {
                uVar18 = 0;
                do {
                  *(double *)(lVar15 + uVar18 * 8) =
                       adStack_f8[uVar18] * *(double *)(lVar5 + lVar15 + uVar18 * 8) +
                       *(double *)(lVar15 + uVar18 * 8);
                  uVar18 = uVar18 + 1;
                } while (uVar10 != uVar18);
              }
              break;
            case '\x04':
              if (0 < (int)uVar14) {
                uVar18 = 0;
                do {
                  *(double *)(lVar15 + uVar18 * 8) =
                       adStack_98[uVar18] * *(double *)(lVar15 + lVar19 + uVar18 * 8) +
                       *(double *)(lVar15 + uVar18 * 8);
                  uVar18 = uVar18 + 1;
                } while (uVar10 != uVar18);
              }
              if (0 < (int)uVar14) {
                uVar18 = 0;
                do {
                  *(double *)(lVar15 + uVar18 * 8) =
                       adStack_f8[uVar18] * *(double *)(lVar5 + lVar15 + uVar18 * 8) +
                       *(double *)(lVar15 + uVar18 * 8);
                  uVar18 = uVar18 + 1;
                } while (uVar10 != uVar18);
              }
              break;
            case '\x05':
              if (0 < (int)uVar14) {
                uVar18 = 0;
                do {
                  *(double *)(lVar15 + uVar18 * 8) =
                       adStack_c8[uVar18] * *(double *)(lVar15 + lVar19 + uVar18 * 8) +
                       *(double *)(lVar15 + uVar18 * 8);
                  uVar18 = uVar18 + 1;
                } while (uVar10 != uVar18);
              }
              if (0 < (int)uVar14) {
                uVar18 = 0;
                do {
                  *(double *)(lVar15 + uVar18 * 8) =
                       adStack_f8[uVar18] * *(double *)(lVar5 + lVar15 + uVar18 * 8) +
                       *(double *)(lVar15 + uVar18 * 8);
                  uVar18 = uVar18 + 1;
                } while (uVar10 != uVar18);
              }
              break;
            case '\x06':
              if (0 < (int)uVar14) {
                uVar18 = 0;
                do {
                  *(double *)(lVar15 + uVar18 * 8) =
                       adStack_128[uVar18] * *(double *)(lVar5 + lVar15 + uVar18 * 8) +
                       *(double *)(lVar15 + uVar18 * 8);
                  uVar18 = uVar18 + 1;
                } while (uVar10 != uVar18);
              }
              break;
            case '\a':
              if (0 < (int)uVar14) {
                uVar18 = 0;
                do {
                  *(double *)(lVar15 + uVar18 * 8) =
                       adStack_98[uVar18] * *(double *)(lVar15 + lVar19 + uVar18 * 8) +
                       *(double *)(lVar15 + uVar18 * 8);
                  uVar18 = uVar18 + 1;
                } while (uVar10 != uVar18);
              }
              if (0 < (int)uVar14) {
                uVar18 = 0;
                do {
                  *(double *)(lVar15 + uVar18 * 8) =
                       adStack_128[uVar18] * *(double *)(lVar5 + lVar15 + uVar18 * 8) +
                       *(double *)(lVar15 + uVar18 * 8);
                  uVar18 = uVar18 + 1;
                } while (uVar10 != uVar18);
              }
              break;
            case '\b':
              if (0 < (int)uVar14) {
                uVar18 = 0;
                do {
                  *(double *)(lVar15 + uVar18 * 8) =
                       adStack_c8[uVar18] * *(double *)(lVar15 + lVar19 + uVar18 * 8) +
                       *(double *)(lVar15 + uVar18 * 8);
                  uVar18 = uVar18 + 1;
                } while (uVar10 != uVar18);
              }
              if (0 < (int)uVar14) {
                uVar18 = 0;
                do {
                  *(double *)(lVar15 + uVar18 * 8) =
                       adStack_128[uVar18] * *(double *)(lVar5 + lVar15 + uVar18 * 8) +
                       *(double *)(lVar15 + uVar18 * 8);
                  uVar18 = uVar18 + 1;
                } while (uVar10 != uVar18);
              }
            }
            uVar17 = uVar17 + 1;
            lVar15 = lVar15 + (long)(int)uVar14 * 8;
          } while (uVar17 != uVar2);
        }
        uVar11 = uVar11 + 1;
        lVar12 = lVar12 + lVar8 * 8;
      } while (uVar11 != uVar9);
    }
    N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,z,x,z);
    uVar6 = uVar6 + 1;
  } while (uVar6 != 6);
  return;
}

Assistant:

static void GSIter(sunrealtype gamma, N_Vector z, N_Vector x, WebData wdata)
{
  int i, ic, iter, iyoff, jx, jy, ns, mxns, mx, my, x_loc, y_loc;
  sunrealtype beta[NS], beta2[NS], cof1[NS], gam[NS], gam2[NS];
  sunrealtype temp, *cox, *coy, *xd, *zd;

  xd   = N_VGetArrayPointer(x);
  zd   = N_VGetArrayPointer(z);
  ns   = wdata->ns;
  mx   = wdata->mx;
  my   = wdata->my;
  mxns = wdata->mxns;
  cox  = wdata->cox;
  coy  = wdata->coy;

  /* Write matrix as P = D - L - U.
     Load local arrays beta, beta2, gam, gam2, and cof1. */

  for (i = 0; i < ns; i++)
  {
    temp     = ONE / (ONE + TWO * gamma * (cox[i] + coy[i]));
    beta[i]  = gamma * cox[i] * temp;
    beta2[i] = TWO * beta[i];
    gam[i]   = gamma * coy[i] * temp;
    gam2[i]  = TWO * gam[i];
    cof1[i]  = temp;
  }

  /* Begin iteration loop.
  Load vector x with (D-inverse)*z for first iteration. */

  for (jy = 0; jy < my; jy++)
  {
    iyoff = mxns * jy;
    for (jx = 0; jx < mx; jx++)
    {
      ic = iyoff + ns * jx;
      v_prod(xd + ic, cof1, zd + ic, ns); /* x[ic+i] = cof1[i]z[ic+i] */
    }
  }
  N_VConst(ZERO, z);

  /* Looping point for iterations. */

  for (iter = 1; iter <= ITMAX; iter++)
  {
    /* Calculate (D-inverse)*U*x if not the first iteration. */

    if (iter > 1)
    {
      for (jy = 0; jy < my; jy++)
      {
        iyoff = mxns * jy;
        for (jx = 0; jx < mx; jx++)
        { /* order of loops matters */
          ic    = iyoff + ns * jx;
          x_loc = (jx == 0) ? 0 : ((jx == mx - 1) ? 2 : 1);
          y_loc = (jy == 0) ? 0 : ((jy == my - 1) ? 2 : 1);
          switch (3 * y_loc + x_loc)
          {
          case 0: /* jx == 0, jy == 0 */
            /* x[ic+i] = beta2[i]x[ic+ns+i] + gam2[i]x[ic+mxns+i] */
            v_sum_prods(xd + ic, beta2, xd + ic + ns, gam2, xd + ic + mxns, ns);
            break;
          case 1: /* 1 <= jx <= mx-2, jy == 0 */
            /* x[ic+i] = beta[i]x[ic+ns+i] + gam2[i]x[ic+mxns+i] */
            v_sum_prods(xd + ic, beta, xd + ic + ns, gam2, xd + ic + mxns, ns);
            break;
          case 2: /* jx == mx-1, jy == 0 */
            /* x[ic+i] = gam2[i]x[ic+mxns+i] */
            v_prod(xd + ic, gam2, xd + ic + mxns, ns);
            break;
          case 3: /* jx == 0, 1 <= jy <= my-2 */
            /* x[ic+i] = beta2[i]x[ic+ns+i] + gam[i]x[ic+mxns+i] */
            v_sum_prods(xd + ic, beta2, xd + ic + ns, gam, xd + ic + mxns, ns);
            break;
          case 4: /* 1 <= jx <= mx-2, 1 <= jy <= my-2 */
            /* x[ic+i] = beta[i]x[ic+ns+i] + gam[i]x[ic+mxns+i] */
            v_sum_prods(xd + ic, beta, xd + ic + ns, gam, xd + ic + mxns, ns);
            break;
          case 5: /* jx == mx-1, 1 <= jy <= my-2 */
            /* x[ic+i] = gam[i]x[ic+mxns+i] */
            v_prod(xd + ic, gam, xd + ic + mxns, ns);
            break;
          case 6: /* jx == 0, jy == my-1 */
            /* x[ic+i] = beta2[i]x[ic+ns+i] */
            v_prod(xd + ic, beta2, xd + ic + ns, ns);
            break;
          case 7: /* 1 <= jx <= mx-2, jy == my-1 */
            /* x[ic+i] = beta[i]x[ic+ns+i] */
            v_prod(xd + ic, beta, xd + ic + ns, ns);
            break;
          case 8: /* jx == mx-1, jy == my-1 */
            /* x[ic+i] = ZERO */
            v_zero(xd + ic, ns);
            break;
          }
        }
      }
    } /* end if (iter > 1) */

    /* Overwrite x with [(I - (D-inverse)*L)-inverse]*x. */

    for (jy = 0; jy < my; jy++)
    {
      iyoff = mxns * jy;
      for (jx = 0; jx < mx; jx++)
      { /* order of loops matters */
        ic    = iyoff + ns * jx;
        x_loc = (jx == 0) ? 0 : ((jx == mx - 1) ? 2 : 1);
        y_loc = (jy == 0) ? 0 : ((jy == my - 1) ? 2 : 1);
        switch (3 * y_loc + x_loc)
        {
        case 0: /* jx == 0, jy == 0 */ break;
        case 1: /* 1 <= jx <= mx-2, jy == 0 */
          /* x[ic+i] += beta[i]x[ic-ns+i] */
          v_inc_by_prod(xd + ic, beta, xd + ic - ns, ns);
          break;
        case 2: /* jx == mx-1, jy == 0 */
          /* x[ic+i] += beta2[i]x[ic-ns+i] */
          v_inc_by_prod(xd + ic, beta2, xd + ic - ns, ns);
          break;
        case 3: /* jx == 0, 1 <= jy <= my-2 */
          /* x[ic+i] += gam[i]x[ic-mxns+i] */
          v_inc_by_prod(xd + ic, gam, xd + ic - mxns, ns);
          break;
        case 4: /* 1 <= jx <= mx-2, 1 <= jy <= my-2 */
          /* x[ic+i] += beta[i]x[ic-ns+i] + gam[i]x[ic-mxns+i] */
          v_inc_by_prod(xd + ic, beta, xd + ic - ns, ns);
          v_inc_by_prod(xd + ic, gam, xd + ic - mxns, ns);
          break;
        case 5: /* jx == mx-1, 1 <= jy <= my-2 */
          /* x[ic+i] += beta2[i]x[ic-ns+i] + gam[i]x[ic-mxns+i] */
          v_inc_by_prod(xd + ic, beta2, xd + ic - ns, ns);
          v_inc_by_prod(xd + ic, gam, xd + ic - mxns, ns);
          break;
        case 6: /* jx == 0, jy == my-1 */
          /* x[ic+i] += gam2[i]x[ic-mxns+i] */
          v_inc_by_prod(xd + ic, gam2, xd + ic - mxns, ns);
          break;
        case 7: /* 1 <= jx <= mx-2, jy == my-1 */
          /* x[ic+i] += beta[i]x[ic-ns+i] + gam2[i]x[ic-mxns+i] */
          v_inc_by_prod(xd + ic, beta, xd + ic - ns, ns);
          v_inc_by_prod(xd + ic, gam2, xd + ic - mxns, ns);
          break;
        case 8: /* jx == mx-1, jy == my-1 */
          /* x[ic+i] += beta2[i]x[ic-ns+i] + gam2[i]x[ic-mxns+i] */
          v_inc_by_prod(xd + ic, beta2, xd + ic - ns, ns);
          v_inc_by_prod(xd + ic, gam2, xd + ic - mxns, ns);
          break;
        }
      }
    }

    /* Add increment x to z : z <- z+x */

    N_VLinearSum(ONE, z, ONE, x, z);
  }
}